

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O1

Symbol token_end_layout_texp(Env *env)

{
  uint32_t uVar1;
  ContextSort CVar2;
  State *pSVar3;
  Context *pCVar4;
  bool bVar5;
  Symbol SVar6;
  uint uVar7;
  ulong uVar8;
  ContextSort CVar9;
  
  if (env->symbols[9] == true) {
    pSVar3 = env->state;
    uVar1 = (pSVar3->contexts).size;
    if ((uVar1 != 0) && (1 < (int)uVar1)) {
      uVar8 = (ulong)(uVar1 - 1);
      pCVar4 = (pSVar3->contexts).contents;
      if (pCVar4[uVar8].sort < Braces) {
        do {
          uVar7 = (int)uVar8 - 1;
          uVar8 = (ulong)uVar7;
          CVar2 = pCVar4[uVar8].sort;
          CVar9 = CVar2 & ~DoLayout;
          if ((Braces < CVar2) || (CVar9 == Braces)) {
            bVar5 = CVar9 == Braces || CVar2 < TExp;
            SVar6 = (uint)bVar5 + (uint)bVar5 * 8;
            if (uVar1 == 0) {
              return SVar6;
            }
            if (CVar9 != Braces && CVar2 >= TExp) {
              return SVar6;
            }
            (pSVar3->contexts).size = uVar1 - 1;
            return END;
          }
        } while (0 < (int)uVar7);
      }
    }
  }
  return FAIL;
}

Assistant:

static Symbol token_end_layout_texp(Env *env) {
  return (valid(env, END) && layouts_in_texp(env)) ? end_layout(env, "texp") : FAIL;
}